

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  int iVar1;
  uint32 uVar2;
  void *pvVar3;
  bool bVar4;
  PoolingLayerParams_ValidCompletePadding *this_00;
  SamePadding *this_01;
  ValidPadding *this_02;
  SamePadding *from_00;
  ValidPadding *from_01;
  PoolingLayerParams_ValidCompletePadding *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_003bbb38;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->kernelsize_).current_size_ = 0;
  (this->kernelsize_).total_size_ = 0;
  (this->kernelsize_).rep_ = (Rep *)0x0;
  iVar1 = (from->kernelsize_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->kernelsize_,iVar1);
    memcpy(((this->kernelsize_).rep_)->elements,((from->kernelsize_).rep_)->elements,
           (long)(from->kernelsize_).current_size_ << 3);
    (this->kernelsize_).current_size_ = (from->kernelsize_).current_size_;
  }
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->stride_,iVar1);
    memcpy(((this->stride_).rep_)->elements,((from->stride_).rep_)->elements,
           (long)(from->stride_).current_size_ << 3);
    (this->stride_).current_size_ = (from->stride_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  bVar4 = from->globalpooling_;
  this->avgpoolexcludepadding_ = from->avgpoolexcludepadding_;
  this->globalpooling_ = bVar4;
  this->type_ = from->type_;
  this->_oneof_case_[0] = 0;
  uVar2 = from->_oneof_case_[0];
  if (uVar2 == 0x1e) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x1e;
    this_02 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_02);
    (this->PoolingPaddingType_).valid_ = this_02;
    if (from->_oneof_case_[0] == 0x1e) {
      from_01 = (from->PoolingPaddingType_).valid_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (ValidPadding *)&_ValidPadding_default_instance_;
    }
    ValidPadding::MergeFrom(this_02,from_01);
  }
  else if (uVar2 == 0x1f) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x1f;
    this_01 = (SamePadding *)operator_new(0x18);
    SamePadding::SamePadding(this_01);
    (this->PoolingPaddingType_).same_ = this_01;
    if (from->_oneof_case_[0] == 0x1f) {
      from_00 = (from->PoolingPaddingType_).same_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (SamePadding *)&_SamePadding_default_instance_;
    }
    SamePadding::MergeFrom(this_01,from_00);
  }
  else if (uVar2 == 0x20) {
    clear_PoolingPaddingType(this);
    this->_oneof_case_[0] = 0x20;
    this_00 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
    PoolingLayerParams_ValidCompletePadding::PoolingLayerParams_ValidCompletePadding(this_00);
    (this->PoolingPaddingType_).includelastpixel_ = this_00;
    if (from->_oneof_case_[0] == 0x20) {
      from_02 = (from->PoolingPaddingType_).includelastpixel_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_02 = (PoolingLayerParams_ValidCompletePadding *)
                &_PoolingLayerParams_ValidCompletePadding_default_instance_;
    }
    PoolingLayerParams_ValidCompletePadding::MergeFrom(this_00,from_02);
  }
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams(const PoolingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case kIncludeLastPixel: {
      mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from.includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams)
}